

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

LClosure * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,Dyndata *dyd,char *name,int firstchar)

{
  StkId pTVar1;
  LClosure *o;
  Proto *v;
  TString *source;
  char *pcVar2;
  LexState lexstate;
  FuncState funcstate;
  BlockCnt bl;
  LexState local_130;
  FuncState local_c0;
  BlockCnt local_80;
  expdesc local_68;
  
  o = luaF_newLclosure(L,1);
  if ((o->tt & 0xe) < 10) {
    pTVar1 = L->top;
    (pTVar1->value_).gc = (GCObject *)o;
    pTVar1->tt_ = 0x8006;
    if ((o->tt == '\x06') && ((o->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
      luaD_inctop(L);
      local_130.h = luaH_new(L);
      if (((local_130.h)->tt & 0xe) < 10) {
        pTVar1 = L->top;
        (pTVar1->value_).gc = (GCObject *)local_130.h;
        pTVar1->tt_ = 0x8005;
        if (((local_130.h)->tt == '\x05') &&
           (((local_130.h)->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
          luaD_inctop(L);
          v = luaF_newproto(L);
          o->p = v;
          local_c0.f = v;
          if (((o->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
            if (9 < (o->tt & 0xe)) {
              pcVar2 = "(((cl)->tt) & 0x0F) < (9+1)";
LAB_001200e4:
              __assert_fail(pcVar2,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                            ,0x9dd,
                            "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                           );
            }
            if (9 < (v->tt & 0xe)) {
              pcVar2 = "(((cl->p)->tt) & 0x0F) < (9+1)";
              goto LAB_001200e4;
            }
            luaC_barrier_(L,(GCObject *)o,(GCObject *)v);
          }
          source = luaS_new(L,name);
          v->source = source;
          if (((v->marked & 0x20) != 0) && ((source->marked & 0x18) != 0)) {
            if (9 < (v->tt & 0xe)) {
              pcVar2 = "(((funcstate.f)->tt) & 0x0F) < (9+1)";
LAB_0012010c:
              __assert_fail(pcVar2,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                            ,0x9df,
                            "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                           );
            }
            if (9 < (source->tt & 0xe)) {
              pcVar2 = "(((funcstate.f->source)->tt) & 0x0F) < (9+1)";
              goto LAB_0012010c;
            }
            luaC_barrier_(L,(GCObject *)v,(GCObject *)source);
            source = v->source;
          }
          (dyd->label).n = 0;
          (dyd->gt).n = 0;
          (dyd->actvar).n = 0;
          local_130.buff = buff;
          local_130.dyd = dyd;
          luaX_setinput(L,&local_130,z,source,firstchar);
          local_68.ravi_type_map = 0;
          local_68._36_4_ = 0;
          local_68.usertype = (TString *)0x0;
          local_68.pc = 0;
          local_68._52_4_ = 0;
          local_68.k = VVOID;
          local_68._4_4_ = 0;
          local_68.u.ival = 0;
          local_68.u.ind.usertype = (TString *)0x0;
          local_68.t = 0;
          local_68.f = 0;
          open_func(&local_130,&local_c0,&local_80);
          (local_c0.f)->is_vararg = '\x01';
          local_68.t = -1;
          local_68.f = -1;
          local_68.k = VLOCAL;
          local_68.u.ival = local_68.u.ival & 0xffffffff00000000;
          local_68.ravi_type_map = 0xffffffff;
          local_68.usertype = (TString *)0x0;
          local_68.pc = -1;
          local_68.u.ind.usertype = (TString *)0x0;
          newupvalue(&local_c0,local_130.envn,&local_68);
          if ((((local_c0.f)->marked & 0x20) != 0) && (((local_130.envn)->marked & 0x18) != 0)) {
            if (((local_c0.f)->tt & 0xe) < 10) {
              if (((local_130.envn)->tt & 0xe) < 10) {
                luaC_barrier_(local_130.L,(GCObject *)local_c0.f,(GCObject *)local_130.envn);
                goto LAB_0011ffa6;
              }
              pcVar2 = "(((ls->envn)->tt) & 0x0F) < (9+1)";
            }
            else {
              pcVar2 = "(((fs->f)->tt) & 0x0F) < (9+1)";
            }
            __assert_fail(pcVar2,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                          ,0x9ca,"void mainfunc(LexState *, FuncState *)");
          }
LAB_0011ffa6:
          luaX_next(&local_130);
          statlist(&local_130);
          if (local_130.t.token != 0x122) {
            error_expected(&local_130,0x122);
          }
          close_func(&local_130);
          if (((local_c0.prev == (FuncState *)0x0) && (local_c0.nups == '\x01')) &&
             (local_130.fs == (FuncState *)0x0)) {
            if ((((dyd->actvar).n == 0) && ((dyd->gt).n == 0)) && ((dyd->label).n == 0)) {
              L->top = L->top + -1;
              return o;
            }
            __assert_fail("dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                          ,0x9e7,
                          "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                         );
          }
          __assert_fail("!funcstate.prev && funcstate.nups == 1 && !lexstate.fs",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                        ,0x9e5,
                        "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                       );
        }
        pcVar2 = "0";
      }
      else {
        pcVar2 = "(((x_)->tt) & 0x0F) < (9+1)";
      }
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x9da,
                    "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                   );
    }
    pcVar2 = "0";
  }
  else {
    pcVar2 = "(((x_)->tt) & 0x0F) < (9+1)";
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x9d7,
                "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
               );
}

Assistant:

LClosure *luaY_parser (lua_State *L, ZIO *z, Mbuffer *buff,
                       Dyndata *dyd, const char *name, int firstchar) {
  LexState lexstate;
  FuncState funcstate;
  LClosure *cl = luaF_newLclosure(L, 1);  /* create main closure */
  setclLvalue(L, L->top, cl);  /* anchor it (to avoid being collected) */
  luaD_inctop(L);
  lexstate.h = luaH_new(L);  /* create table for scanner */
  sethvalue(L, L->top, lexstate.h);  /* anchor it */
  luaD_inctop(L);
  funcstate.f = cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  funcstate.f->source = luaS_new(L, name);  /* create and anchor TString */
  luaC_objbarrier(L, funcstate.f, funcstate.f->source);
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  dyd->actvar.n = dyd->gt.n = dyd->label.n = 0;
  luaX_setinput(L, &lexstate, z, funcstate.f->source, firstchar);
  mainfunc(&lexstate, &funcstate);
  lua_assert(!funcstate.prev && funcstate.nups == 1 && !lexstate.fs);
  /* all scopes should be correctly finished */
  lua_assert(dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0);
  L->top--;  /* remove scanner's table */
  return cl;  /* closure is on the stack, too */
}